

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_source_atop(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint32_t uVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  if (0 < length) {
    uVar3 = (ulong)(uint)length;
  }
  if (const_alpha == 0xff) {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = INTERPOLATE_PIXEL(src[uVar2],dest[uVar2] >> 0x18,dest[uVar2],~src[uVar2] >> 0x18);
      dest[uVar2] = uVar1;
    }
  }
  else {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = BYTE_MUL(src[uVar2],const_alpha);
      uVar1 = INTERPOLATE_PIXEL(uVar1,dest[uVar2] >> 0x18,dest[uVar2],~uVar1 >> 0x18);
      dest[uVar2] = uVar1;
    }
  }
  return;
}

Assistant:

static void composition_source_atop(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            uint32_t s = src[i];
            uint32_t d = dest[i];
            dest[i] = INTERPOLATE_PIXEL(s, plutovg_alpha(d), d, plutovg_alpha(~s));
        }
    } else {
        for(int i = 0; i < length; i++) {
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            uint32_t d = dest[i];
            dest[i] = INTERPOLATE_PIXEL(s, plutovg_alpha(d), d, plutovg_alpha(~s));
        }
    }
}